

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfs-seq.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint d_00;
  uint uVar1;
  double dVar2;
  double dVar3;
  double t2;
  int i;
  double t1;
  int m;
  int d;
  char **argv_local;
  int argc_local;
  
  if (argc <= _optind + 3) {
    usage(*argv);
    exit(1);
  }
  d_00 = atoi(argv[_optind]);
  w = atoi(argv[_optind + 1]);
  n = atoi(argv[_optind + 2]);
  uVar1 = atoi(argv[_optind + 3]);
  printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n",
         (ulong)uVar1,(ulong)d_00,(ulong)(uint)w,(ulong)(uint)n);
  dVar2 = wctime();
  for (t2._4_4_ = 0; t2._4_4_ < (int)uVar1; t2._4_4_ = t2._4_4_ + 1) {
    tree(d_00);
  }
  dVar3 = wctime();
  printf("Time: %f\n",dVar3 - dVar2);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    if (optind + 3 >= argc) {
        usage(argv[0]);
        exit(1);
    }

    int d, m;

    d = atoi(argv[optind]);
    w = atoi(argv[optind+1]);
    n = atoi(argv[optind+2]);
    m = atoi(argv[optind+3]);

    printf("Running depth first search on %d balanced trees with depth %d, width %d, grain %d.\n", m, d, w, n);

    double t1 = wctime();
    int i;
    for(i=0; i<m; i++) tree(d);
    double t2 = wctime();

    printf("Time: %f\n", t2-t1);

    return 0;
}